

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint node_index)

{
  uint min_new_capacity;
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vq_node *pvVar5;
  uint *puVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  
  fVar1 = (this->m_nodes).m_p[node_index].m_variance;
  uVar2 = this->m_heap_size;
  uVar4 = uVar2 + 1;
  this->m_heap_size = uVar4;
  uVar3 = (this->m_heap).m_size;
  if (uVar3 <= uVar4) {
    min_new_capacity = uVar2 + 2;
    if (uVar3 != min_new_capacity) {
      if (uVar3 <= min_new_capacity) {
        if ((this->m_heap).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_heap,min_new_capacity,uVar3 == uVar2 + 1,4,
                     (object_mover)0x0,false);
        }
        uVar3 = (this->m_heap).m_size;
        memset((this->m_heap).m_p + uVar3,0,(ulong)(min_new_capacity - uVar3) << 2);
      }
      (this->m_heap).m_size = min_new_capacity;
    }
  }
  pvVar5 = (this->m_nodes).m_p;
  puVar6 = (this->m_heap).m_p;
  uVar8 = (ulong)uVar4;
  do {
    if ((uint)uVar8 < 2) {
LAB_00143cd5:
      bVar7 = false;
      uVar9 = uVar8;
    }
    else {
      uVar9 = uVar8 >> 1;
      uVar4 = puVar6[uVar9];
      if (fVar1 < pvVar5[uVar4].m_variance) goto LAB_00143cd5;
      puVar6[uVar8] = uVar4;
      bVar7 = true;
    }
    uVar8 = uVar9;
    if (!bVar7) {
      (this->m_heap).m_p[uVar9] = node_index;
      return;
    }
  } while( true );
}

Assistant:

void insert_heap(uint node_index)
        {
            const float variance = m_nodes[node_index].m_variance;
            uint pos = ++m_heap_size;

            if (m_heap_size >= m_heap.size())
            {
                m_heap.resize(m_heap_size + 1);
            }

            for (;;)
            {
                uint parent = pos >> 1;
                if (!parent)
                {
                    break;
                }

                float parent_variance = m_nodes[m_heap[parent]].m_variance;
                if (parent_variance > variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[parent];

                pos = parent;
            }

            m_heap[pos] = node_index;
        }